

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

string * __thiscall
cmGlobalNinjaMultiGenerator::OrderDependsTargetForTarget
          (string *__return_storage_ptr__,cmGlobalNinjaMultiGenerator *this,
          cmGeneratorTarget *target,string *config)

{
  pointer pcVar1;
  size_type sVar2;
  string *psVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_b8;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [32];
  basic_string_view<char,_std::char_traits<char>_> local_68;
  size_type local_58;
  pointer local_50;
  undefined8 local_48;
  undefined1 *local_40;
  size_type local_38;
  pointer local_30;
  
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  sVar2 = psVar3->_M_string_length;
  cmsys::SystemTools::UpperCase(&local_b8,config);
  local_68._M_len = 0x22;
  local_68._M_str = "cmake_object_order_depends_target_";
  local_90 = local_88;
  local_98 = 1;
  local_88[0] = 0x5f;
  local_48 = 1;
  local_38 = local_b8._M_string_length;
  local_30 = local_b8._M_dataplus._M_p;
  views._M_len = 4;
  views._M_array = &local_68;
  local_58 = sVar2;
  local_50 = pcVar1;
  local_40 = local_90;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaMultiGenerator::OrderDependsTargetForTarget(
  cmGeneratorTarget const* target, const std::string& config) const
{
  return cmStrCat("cmake_object_order_depends_target_", target->GetName(), '_',
                  cmSystemTools::UpperCase(config));
}